

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

Vec_Int_t * Acb_NtkCollectCopies(Acb_Ntk_t *p,Gia_Man_t *pGia,Vec_Ptr_t **pvNodesR)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *__ptr;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  void **__s;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  char *__dest;
  int iVar9;
  uint uVar10;
  long lVar11;
  
  __ptr = Acb_NtkFindNodes2(p);
  iVar1 = (p->vObjType).nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar1 - 2U) {
    iVar9 = iVar1 + -1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar9;
  if (iVar9 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar9 << 2);
  }
  p_00->pArray = piVar4;
  iVar1 = pGia->nObjs;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  iVar9 = 8;
  if (6 < iVar1 - 1U) {
    iVar9 = iVar1;
  }
  pVVar5->nCap = iVar9;
  if (iVar9 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar9 << 3);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar1;
  memset(__s,0,(long)iVar1 << 3);
  iVar9 = __ptr->nSize;
  piVar4 = __ptr->pArray;
  if ((long)iVar9 < 1) {
    if (piVar4 == (int *)0x0) goto LAB_00388378;
  }
  else {
    lVar11 = 0;
    do {
      uVar2 = piVar4[lVar11];
      lVar6 = (long)(int)uVar2;
      if (lVar6 < 1) {
        pcVar7 = "i>0";
LAB_003883e9:
        __assert_fail(pcVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
      }
      uVar10 = (p->vObjCopy).nSize;
      if ((int)uVar10 < 1) {
        pcVar7 = "Acb_NtkHasObjCopies(p)";
        goto LAB_003883e9;
      }
      if (uVar10 <= uVar2) {
LAB_003883ba:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar10 = (p->vObjCopy).pArray[lVar6];
      if (-1 < (int)uVar10) {
        uVar10 = uVar10 >> 1;
        if (pGia->nObjs <= (int)uVar10) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(pGia->pObjs + uVar10) & 0x1fffffff) != 0 &&
            -1 < (int)*(uint *)(pGia->pObjs + uVar10)) {
          if (iVar1 <= (int)uVar10) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (__s[uVar10] == (void *)0x0) {
            uVar3 = (p->vObjName).nSize;
            if ((int)uVar3 < 1) {
              __assert_fail("Acb_NtkHasObjNames(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                            ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
            }
            if (uVar3 <= uVar2) goto LAB_003883ba;
            pcVar7 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[lVar6]);
            if (pcVar7 == (char *)0x0) {
              __dest = (char *)0x0;
            }
            else {
              sVar8 = strlen(pcVar7);
              __dest = (char *)malloc(sVar8 + 1);
              strcpy(__dest,pcVar7);
            }
            __s[uVar10] = __dest;
            Vec_IntPush(p_00,uVar10);
          }
        }
      }
      lVar11 = lVar11 + 1;
    } while (iVar9 != lVar11);
  }
  free(piVar4);
LAB_00388378:
  free(__ptr);
  qsort(p_00->pArray,(long)p_00->nSize,4,Vec_IntSortCompare1);
  *pvNodesR = pVVar5;
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkCollectCopies( Acb_Ntk_t * p, Gia_Man_t * pGia, Vec_Ptr_t ** pvNodesR )
{
    int i, iObj, iLit;
    Vec_Int_t * vObjs   = Acb_NtkFindNodes2( p );
    Vec_Int_t * vNodes  = Vec_IntAlloc( Acb_NtkObjNum(p) );
    Vec_Ptr_t * vNodesR = Vec_PtrStart( Gia_ManObjNum(pGia) );
    Vec_IntForEachEntry( vObjs, iObj, i )
        if ( (iLit = Acb_ObjCopy(p, iObj)) >= 0 && Gia_ObjIsAnd(Gia_ManObj(pGia, Abc_Lit2Var(iLit))) )
        {
            if ( Vec_PtrEntry(vNodesR, Abc_Lit2Var(iLit)) == NULL )
            {
                Vec_PtrWriteEntry( vNodesR, Abc_Lit2Var(iLit), Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
                Vec_IntPush( vNodes, Abc_Lit2Var(iLit) );
            }
        }
    Vec_IntFree( vObjs );
    Vec_IntSort( vNodes, 0 );
    *pvNodesR = vNodesR;
    return vNodes;
}